

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int archive_read_open1(archive *_a)

{
  int iVar1;
  archive_read *a_00;
  archive_read_filter *in_RDI;
  int magic_test;
  uint i;
  int e;
  int slot;
  archive_read_filter *tmp;
  archive_read_filter *filter;
  archive_read *a;
  char *in_stack_00000068;
  uint in_stack_00000070;
  uint in_stack_00000074;
  archive *in_stack_00000078;
  uint local_34;
  int local_30;
  archive_read *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
  if (iVar1 == -0x1e) {
    local_30 = -0x1e;
  }
  else {
    archive_clear_error((archive *)in_RDI);
    if (in_RDI[1].archive == (archive_read *)0x0) {
      archive_set_error((archive *)in_RDI,0x16,"No reader function provided to archive_read_open");
      *(uint *)((long)&in_RDI->position + 4) = 0x8000;
      local_30 = -0x1e;
    }
    else if ((in_RDI[1].upstream == (archive_read_filter *)0x0) ||
            (local_30 = (*(code *)in_RDI[1].upstream)
                                  (in_RDI,*(undefined8 *)((long)in_RDI[1].data + 0x10)),
            local_30 == 0)) {
      a_00 = (archive_read *)calloc(1,0xb0);
      if (a_00 == (archive_read *)0x0) {
        local_30 = -0x1e;
      }
      else {
        (a_00->archive).vtable = (archive_vtable_conflict *)0x0;
        *(undefined8 *)&(a_00->archive).archive_format = 0;
        (a_00->archive).archive_format_name = (char *)in_RDI;
        (a_00->archive).error_string.buffer_length = *(size_t *)((long)in_RDI[1].data + 0x10);
        *(code **)&(a_00->archive).compression_code = client_open_proxy;
        (a_00->archive).compression_name = (char *)client_read_proxy;
        *(code **)&(a_00->archive).file_count = client_skip_proxy;
        (a_00->archive).error = (char *)client_seek_proxy;
        (a_00->archive).error_string.s = (char *)client_close_proxy;
        (a_00->archive).error_string.length = (size_t)client_switch_proxy;
        (a_00->archive).current_code = "none";
        (a_00->archive).current_codepage = 0;
        *(undefined8 *)in_RDI[1].data = 0;
        if ((in_RDI[5].seek == (_func_int64_t_archive_read_filter_ptr_int64_t_int *)0x0) ||
           (*(int *)&in_RDI[5].close == 0)) {
          in_RDI[5].seek = (_func_int64_t_archive_read_filter_ptr_int64_t_int *)a_00;
          local_30 = choose_filters((archive_read *)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
          if (local_30 < -0x14) {
            *(uint *)((long)&in_RDI->position + 4) = 0x8000;
            return -0x1e;
          }
        }
        else {
          for (in_stack_ffffffffffffffd8 = (archive_read *)in_RDI[5].seek;
              *(long *)&(in_stack_ffffffffffffffd8->archive).archive_format != 0;
              in_stack_ffffffffffffffd8 =
                   *(archive_read **)&(in_stack_ffffffffffffffd8->archive).archive_format) {
          }
          *(archive_read **)&(in_stack_ffffffffffffffd8->archive).archive_format = a_00;
        }
        if (in_RDI[0xd].name == (char *)0x0) {
          iVar1 = choose_format(in_stack_ffffffffffffffd8);
          if (iVar1 < 0) {
            __archive_read_close_filters(a_00);
            *(uint *)((long)&in_RDI->position + 4) = 0x8000;
            return -0x1e;
          }
          in_RDI[0xd].name = (char *)(&in_RDI[5].name + (long)iVar1 * 0xb);
        }
        *(undefined4 *)((long)&in_RDI->position + 4) = 2;
        client_switch_proxy(in_RDI,(uint)((ulong)a_00 >> 0x20));
      }
    }
    else if (in_RDI[1].skip != (_func_int64_t_archive_read_filter_ptr_int64_t *)0x0) {
      for (local_34 = 0; local_34 < *(uint *)&in_RDI[1].close; local_34 = local_34 + 1) {
        (*in_RDI[1].skip)(in_RDI,*(int64_t *)((long)in_RDI[1].data + (ulong)local_34 * 0x18 + 0x10))
        ;
      }
    }
  }
  return local_30;
}

Assistant:

int
archive_read_open1(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter, *tmp;
	int slot, e;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_open");
	archive_clear_error(&a->archive);

	if (a->client.reader == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "No reader function provided to archive_read_open");
		a->archive.state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}

	/* Open data source. */
	if (a->client.opener != NULL) {
		e = (a->client.opener)(&a->archive, a->client.dataset[0].data);
		if (e != 0) {
			/* If the open failed, call the closer to clean up. */
			if (a->client.closer) {
				for (i = 0; i < a->client.nodes; i++)
					(a->client.closer)(&a->archive,
					    a->client.dataset[i].data);
			}
			return (e);
		}
	}

	filter = calloc(1, sizeof(*filter));
	if (filter == NULL)
		return (ARCHIVE_FATAL);
	filter->bidder = NULL;
	filter->upstream = NULL;
	filter->archive = a;
	filter->data = a->client.dataset[0].data;
	filter->open = client_open_proxy;
	filter->read = client_read_proxy;
	filter->skip = client_skip_proxy;
	filter->seek = client_seek_proxy;
	filter->close = client_close_proxy;
	filter->sswitch = client_switch_proxy;
	filter->name = "none";
	filter->code = ARCHIVE_FILTER_NONE;

	a->client.dataset[0].begin_position = 0;
	if (!a->filter || !a->bypass_filter_bidding)
	{
		a->filter = filter;
		/* Build out the input pipeline. */
		e = choose_filters(a);
		if (e < ARCHIVE_WARN) {
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	else
	{
		/* Need to add "NONE" type filter at the end of the filter chain */
		tmp = a->filter;
		while (tmp->upstream)
			tmp = tmp->upstream;
		tmp->upstream = filter;
	}

	if (!a->format)
	{
		slot = choose_format(a);
		if (slot < 0) {
			__archive_read_close_filters(a);
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
		a->format = &(a->formats[slot]);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;

	/* Ensure libarchive starts from the first node in a multivolume set */
	client_switch_proxy(a->filter, 0);
	return (e);
}